

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::point3d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,point3d *v)

{
  double dVar1;
  bool bVar2;
  pointer pSVar3;
  value_type *pvVar4;
  pointer pSVar5;
  optional<tinyusdz::value::point3d> pv;
  optional<tinyusdz::value::point3d> local_60;
  optional<tinyusdz::value::point3d> local_40;
  
  if (v == (point3d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<tinyusdz::value::point3d>(&local_60,this);
    local_40.has_value_ = local_60.has_value_;
    if (local_60.has_value_ == true) goto LAB_001c32a2;
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar3 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar3) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::point3d,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  bVar2 = has_value(this);
  if (bVar2) {
    get_default_value<tinyusdz::value::point3d>(&local_60,this);
    local_40.has_value_ = local_60.has_value_;
    if (local_60.has_value_ != false) {
LAB_001c32a2:
      local_40.contained._16_8_ = local_60.contained._16_8_;
      local_40.contained.data.__align = local_60.contained.data.__align;
      local_40.contained._8_8_ = local_60.contained._8_8_;
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::value::point3d>::value(&local_40);
      dVar1 = pvVar4->y;
      v->x = pvVar4->x;
      v->y = dVar1;
      v->z = pvVar4->z;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }